

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t prefix_w(wchar_t *start,wchar_t *end,wchar_t *test)

{
  bool bVar1;
  wchar_t *test_local;
  wchar_t *end_local;
  wchar_t *start_local;
  wchar_t local_4;
  
  if (start == end) {
    local_4 = L'\0';
  }
  else {
    start_local = start + 1;
    test_local = test + 1;
    if (*start == *test) {
      do {
        bVar1 = false;
        if (start_local < end) {
          bVar1 = *start_local == *test_local;
          test_local = test_local + 1;
          start_local = start_local + 1;
        }
      } while (bVar1);
      if (start_local < end) {
        local_4 = L'\0';
      }
      else {
        local_4 = L'\x01';
      }
    }
    else {
      local_4 = L'\0';
    }
  }
  return local_4;
}

Assistant:

static int
prefix_w(const wchar_t *start, const wchar_t *end, const wchar_t *test)
{
	if (start == end)
		return (0);

	if (*start++ != *test++)
		return (0);

	while (start < end  &&  *start++ == *test++)
		;

	if (start < end)
		return (0);

	return (1);
}